

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O1

byte_vec_t * sfc::read_binary(byte_vec_t *__return_storage_ptr__,string *path)

{
  runtime_error *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  format_args args;
  ifstream ifs;
  string sStack_258;
  pointer local_238;
  size_type sStack_230;
  long local_228 [4];
  byte abStack_208 [200];
  undefined8 auStack_140 [36];
  
  std::ifstream::ifstream(local_228,(string *)path,_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    __first._8_8_ = 0xffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_140 + *(long *)(local_228[0] + -0x18));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first
               ,(istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
               (allocator_type *)&sStack_258);
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_238 = (path->_M_dataplus)._M_p;
  sStack_230 = path->_M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x1d;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_238;
  ::fmt::v10::vformat_abi_cxx11_(&sStack_258,(v10 *)"File \"{}\" could not be opened",fmt,args);
  std::runtime_error::runtime_error(this,(string *)&sStack_258);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline byte_vec_t read_binary(const std::string& path) {
  std::ifstream ifs(path, std::ios::binary);
  if (ifs.fail()) {
    throw std::runtime_error(fmt::format("File \"{}\" could not be opened", path));
  }
  return byte_vec_t((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
}